

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__s1;
  ulong uVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  uchar *d;
  int iVar9;
  long lVar10;
  size_t __n;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  
  bVar15 = (comp - 2U & 0xfffffffd) == 0;
  uVar13 = (uint)bVar15;
  iVar9 = comp - uVar13;
  if ((y | x) < 0) {
    iVar9 = 0;
  }
  else {
    uVar7 = iVar9 < 2 | 2;
    if (stbi_write_tga_with_rle == 0) {
      iVar9 = stbiw__outfile(s,uVar7,0,x,y,comp,0,data,(uint)bVar15,0,"111 221 2222 11",0,0,
                             (ulong)uVar7,0,0,0,0,0,(ulong)(uint)x,(ulong)(uint)y,
                             (ulong)((iVar9 + uVar13) * 8),(ulong)((uint)bVar15 * 8));
    }
    else {
      uVar7 = iVar9 < 2 | 10;
      d = (uchar *)0x0;
      stbiw__writef(s,(char *)(ulong)uVar7,0,0,(ulong)uVar7,0,0,0,0,0,(ulong)(uint)x,(ulong)(uint)y,
                    (ulong)((iVar9 + uVar13) * 8),(ulong)((uint)bVar15 * 8));
      uVar7 = -(uint)(stbi__flip_vertically_on_write == 0) | y;
      uVar13 = y - 1;
      if (stbi__flip_vertically_on_write != 0) {
        uVar13 = 0;
      }
      if (uVar13 != uVar7) {
        iVar9 = 1;
        if (stbi__flip_vertically_on_write == 0) {
          iVar9 = -1;
        }
        iVar8 = comp * x;
        __n = (size_t)comp;
        iVar2 = uVar13 * iVar8;
        do {
          if (0 < x) {
            iVar4 = 0;
            do {
              uVar12 = 1;
              if (iVar4 < x + -1) {
                __s1 = (void *)((long)data + (long)(iVar4 * comp) + (long)(int)(iVar8 * uVar13));
                iVar1 = bcmp(__s1,(void *)((long)data +
                                          (long)((iVar4 + 1) * comp) + (long)(int)(iVar8 * uVar13)),
                             __n);
                iVar3 = iVar4 + 2;
                uVar12 = 2;
                if (iVar1 != 0) {
                  if (iVar3 < x) {
                    lVar10 = (long)iVar3;
                    pvVar6 = (void *)((long)data + __n * lVar10 + (long)iVar2);
                    uVar12 = 1;
                    do {
                      lVar10 = lVar10 + 1;
                      iVar1 = bcmp(__s1,pvVar6,__n);
                      if (iVar1 == 0) goto LAB_00103614;
                      iVar1 = (int)uVar12;
                      uVar11 = iVar1 + 1;
                      uVar12 = (ulong)uVar11;
                      if (x <= lVar10) break;
                      __s1 = (void *)((long)__s1 + __n);
                      pvVar6 = (void *)((long)pvVar6 + __n);
                    } while (uVar11 < 0x7f);
                    uVar12 = (ulong)(iVar1 + 2);
                  }
                  goto LAB_00103614;
                }
                if (iVar3 < x) {
                  lVar10 = (long)iVar3;
                  pvVar6 = (void *)((long)data + __n * lVar10 + (long)iVar2);
                  uVar11 = 2;
                  while( true ) {
                    lVar10 = lVar10 + 1;
                    iVar1 = bcmp(__s1,pvVar6,__n);
                    if (iVar1 != 0) break;
                    uVar12 = (ulong)(uVar11 + 1);
                    if ((x <= lVar10) ||
                       (pvVar6 = (void *)((long)pvVar6 + __n), bVar14 = 0x7e < uVar11,
                       uVar11 = uVar11 + 1, bVar14)) goto LAB_001036e9;
                  }
                  uVar12 = (ulong)uVar11;
                }
LAB_001036e9:
                iVar1 = s->buf_used;
                if (0x40 < (long)iVar1 + 1U) {
                  (*s->func)(s->context,s->buffer,iVar1);
                  iVar1 = 0;
                }
                s->buf_used = iVar1 + 1;
                s->buffer[iVar1] = (char)uVar12 + '\x7f';
                stbiw__write_pixel(s,comp,(uint)bVar15,0,(int)__s1,d);
              }
              else {
LAB_00103614:
                iVar1 = s->buf_used;
                if (0x40 < (long)iVar1 + 1U) {
                  (*s->func)(s->context,s->buffer,iVar1);
                  iVar1 = 0;
                }
                s->buf_used = iVar1 + 1;
                s->buffer[iVar1] = (char)uVar12 + 0xff;
                if (0 < (int)uVar12) {
                  lVar10 = (long)data + (long)(iVar4 * comp) + (long)iVar2;
                  uVar5 = uVar12;
                  do {
                    stbiw__write_pixel(s,comp,(uint)bVar15,0,(int)lVar10,d);
                    lVar10 = lVar10 + __n;
                    uVar5 = uVar5 - 1;
                  } while (uVar5 != 0);
                }
              }
              iVar4 = iVar4 + (int)uVar12;
            } while (iVar4 < x);
          }
          uVar13 = uVar13 + iVar9;
          iVar2 = iVar2 + iVar9 * iVar8;
        } while (uVar7 != uVar13);
      }
      iVar9 = 1;
      if (s->buf_used != 0) {
        (*s->func)(s->context,s->buffer,s->buf_used);
        s->buf_used = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}